

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::ReadInt64(ON_BinaryArchive *this,size_t count,ON__INT64 *p)

{
  undefined1 uVar1;
  ON__INT64 OVar2;
  bool bVar3;
  ON__INT64 *pOStack_30;
  uchar c;
  uchar *b;
  bool rc;
  ON__INT64 *p_local;
  size_t count_local;
  ON_BinaryArchive *this_local;
  
  bVar3 = ReadByte(this,count << 3,p);
  if ((bVar3) && (pOStack_30 = p, p_local = (ON__INT64 *)count, this->m_endian == big_endian)) {
    while (p_local != (ON__INT64 *)0x0) {
      OVar2 = *pOStack_30;
      *(undefined1 *)pOStack_30 = *(undefined1 *)((long)pOStack_30 + 7);
      *(char *)((long)pOStack_30 + 7) = (char)OVar2;
      uVar1 = *(undefined1 *)((long)pOStack_30 + 1);
      *(undefined1 *)((long)pOStack_30 + 1) = *(undefined1 *)((long)pOStack_30 + 6);
      *(undefined1 *)((long)pOStack_30 + 6) = uVar1;
      uVar1 = *(undefined1 *)((long)pOStack_30 + 2);
      *(undefined1 *)((long)pOStack_30 + 2) = *(undefined1 *)((long)pOStack_30 + 5);
      *(undefined1 *)((long)pOStack_30 + 5) = uVar1;
      uVar1 = *(undefined1 *)((long)pOStack_30 + 3);
      *(undefined1 *)((long)pOStack_30 + 3) = *(undefined1 *)((long)pOStack_30 + 4);
      *(undefined1 *)((long)pOStack_30 + 4) = uVar1;
      pOStack_30 = pOStack_30 + 1;
      p_local = (ON__INT64 *)((long)p_local + -1);
    }
  }
  return bVar3;
}

Assistant:

bool
ON_BinaryArchive::ReadInt64( // Read an array of 64 bit integers
		size_t count,            // number of 64 bit integers to read
		ON__INT64* p
		)
{
  bool rc = ReadByte( count<<3, p );
  if (rc && m_endian == ON::endian::big_endian)
  {
		unsigned char* b=(unsigned char*)p;
		unsigned char  c;
		while(count--) {
			c = b[0]; b[0] = b[7]; b[7] = c;
			c = b[1]; b[1] = b[6]; b[6] = c;
			c = b[2]; b[2] = b[5]; b[5] = c;
			c = b[3]; b[3] = b[4]; b[4] = c;
			b += 8;
		}
  }
  return rc;
}